

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O2

void opn2_setNoteHook(OPN2_MIDIPlayer *device,OPN2_NoteHook noteHook,void *userData)

{
  void *pvVar1;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    pvVar1 = device->opn2_midiPlayer;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x3c0,"void opn2_setNoteHook(struct OPN2_MIDIPlayer *, OPN2_NoteHook, void *)")
      ;
    }
    *(OPN2_NoteHook *)((long)pvVar1 + 0x20) = noteHook;
    *(void **)((long)pvVar1 + 0x28) = userData;
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setNoteHook(struct OPN2_MIDIPlayer *device, OPN2_NoteHook noteHook, void *userData)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->hooks.onNote = noteHook;
    play->hooks.onNote_userData = userData;
}